

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_sps.c
# Opt level: O2

MPP_RET h264e_sps_to_packet(H264eSps *sps,MppPacket packet,RK_S32 *offset,RK_S32 *len,
                           MppEncCfgSet *cfg)

{
  RK_S32 RVar1;
  void *pvVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  MppWriteCtx bit_ctx;
  
  pvVar2 = mpp_packet_get_pos(packet);
  pvVar3 = mpp_packet_get_data(packet);
  sVar4 = mpp_packet_get_size(packet);
  sVar5 = mpp_packet_get_length(packet);
  mpp_writer_init(&bit_ctx,(void *)((long)pvVar2 + sVar5),
                  ((int)sVar4 + (int)pvVar3) - (int)(void *)((long)pvVar2 + sVar5));
  mpp_writer_put_raw_bits(&bit_ctx,0,0x18);
  mpp_writer_put_raw_bits(&bit_ctx,1,8);
  mpp_writer_put_raw_bits(&bit_ctx,0,1);
  mpp_writer_put_raw_bits(&bit_ctx,3,2);
  mpp_writer_put_raw_bits(&bit_ctx,7,5);
  mpp_writer_put_bits(&bit_ctx,sps->profile_idc,8);
  mpp_writer_put_bits(&bit_ctx,sps->constraint_set0,1);
  mpp_writer_put_bits(&bit_ctx,sps->constraint_set1,1);
  mpp_writer_put_bits(&bit_ctx,sps->constraint_set2,1);
  mpp_writer_put_bits(&bit_ctx,sps->constraint_set3,1);
  mpp_writer_put_bits(&bit_ctx,sps->constraint_set4,1);
  mpp_writer_put_bits(&bit_ctx,sps->constraint_set5,1);
  mpp_writer_put_bits(&bit_ctx,0,2);
  mpp_writer_put_bits(&bit_ctx,sps->level_idc,8);
  mpp_writer_put_ue(&bit_ctx,sps->sps_id);
  if (99 < sps->profile_idc) {
    mpp_writer_put_ue(&bit_ctx,sps->chroma_format_idc);
    mpp_writer_put_ue(&bit_ctx,0);
    mpp_writer_put_ue(&bit_ctx,0);
    mpp_writer_put_bits(&bit_ctx,0,1);
    mpp_writer_put_bits(&bit_ctx,0,1);
  }
  mpp_writer_put_ue(&bit_ctx,sps->log2_max_frame_num_minus4);
  mpp_writer_put_ue(&bit_ctx,(cfg->codec).field_1.h264.poc_type);
  if ((cfg->codec).field_1.h264.poc_type == 0) {
    mpp_writer_put_ue(&bit_ctx,sps->log2_max_poc_lsb_minus4);
  }
  mpp_writer_put_ue(&bit_ctx,sps->num_ref_frames);
  mpp_writer_put_bits(&bit_ctx,sps->gaps_in_frame_num_value_allowed,1);
  mpp_writer_put_ue(&bit_ctx,sps->pic_width_in_mbs - 1);
  mpp_writer_put_ue(&bit_ctx,sps->pic_height_in_mbs - 1);
  mpp_writer_put_bits(&bit_ctx,sps->frame_mbs_only,1);
  mpp_writer_put_bits(&bit_ctx,sps->direct8x8_inference,1);
  mpp_writer_put_bits(&bit_ctx,sps->cropping,1);
  if (sps->cropping != 0) {
    mpp_writer_put_ue(&bit_ctx,(uint)(sps->crop).left /
                               h264e_sps_to_packet::SubWidthC[sps->chroma_format_idc]);
    mpp_writer_put_ue(&bit_ctx,(uint)(sps->crop).right /
                               h264e_sps_to_packet::SubWidthC[sps->chroma_format_idc]);
    mpp_writer_put_ue(&bit_ctx,(uint)(sps->crop).top /
                               h264e_sps_to_packet::SubHeightC[sps->chroma_format_idc]);
    mpp_writer_put_ue(&bit_ctx,(uint)(sps->crop).bottom /
                               h264e_sps_to_packet::SubHeightC[sps->chroma_format_idc]);
  }
  mpp_writer_put_bits(&bit_ctx,(sps->vui).vui_present,1);
  if ((sps->vui).vui_present != 0) {
    mpp_writer_put_bits(&bit_ctx,(sps->vui).aspect_ratio_info_present,1);
    if ((sps->vui).aspect_ratio_info_present != 0) {
      mpp_writer_put_bits(&bit_ctx,(sps->vui).aspect_ratio_idc,8);
      if ((sps->vui).aspect_ratio_idc == 0xff) {
        mpp_writer_put_bits(&bit_ctx,(sps->vui).sar_width,0x10);
        mpp_writer_put_bits(&bit_ctx,(sps->vui).sar_height,0x10);
      }
    }
    mpp_writer_put_bits(&bit_ctx,(sps->vui).overscan_info_present,1);
    if ((sps->vui).overscan_info_present != 0) {
      mpp_writer_put_bits(&bit_ctx,(sps->vui).overscan_appropriate_flag,1);
    }
    mpp_writer_put_bits(&bit_ctx,(sps->vui).signal_type_present,1);
    if ((sps->vui).signal_type_present != 0) {
      mpp_writer_put_bits(&bit_ctx,(sps->vui).vidformat,3);
      mpp_writer_put_bits(&bit_ctx,(sps->vui).fullrange,1);
      mpp_writer_put_bits(&bit_ctx,(sps->vui).color_description_present,1);
      if ((sps->vui).color_description_present != 0) {
        mpp_writer_put_bits(&bit_ctx,(sps->vui).colorprim,8);
        mpp_writer_put_bits(&bit_ctx,(sps->vui).colortrc,8);
        mpp_writer_put_bits(&bit_ctx,(sps->vui).colmatrix,8);
      }
    }
    mpp_writer_put_bits(&bit_ctx,(sps->vui).chroma_loc_info_present,1);
    if ((sps->vui).chroma_loc_info_present != 0) {
      mpp_writer_put_ue(&bit_ctx,(sps->vui).chroma_loc_top);
      mpp_writer_put_ue(&bit_ctx,(sps->vui).chroma_loc_bottom);
    }
    mpp_writer_put_bits(&bit_ctx,(sps->vui).timing_info_present,1);
    if ((sps->vui).timing_info_present != 0) {
      mpp_writer_put_bits(&bit_ctx,(uint)*(ushort *)((long)&(sps->vui).num_units_in_tick + 2),0x10);
      mpp_writer_put_bits(&bit_ctx,(uint)(ushort)(sps->vui).num_units_in_tick,0x10);
      mpp_writer_put_bits(&bit_ctx,(uint)*(ushort *)((long)&(sps->vui).time_scale + 2),0x10);
      mpp_writer_put_bits(&bit_ctx,(uint)(ushort)(sps->vui).time_scale,0x10);
      mpp_writer_put_bits(&bit_ctx,(sps->vui).fixed_frame_rate,1);
    }
    mpp_writer_put_bits(&bit_ctx,(sps->vui).nal_hrd_parameters_present,1);
    mpp_writer_put_bits(&bit_ctx,(sps->vui).vcl_hrd_parameters_present,1);
    mpp_writer_put_bits(&bit_ctx,(sps->vui).pic_struct_present,1);
    mpp_writer_put_bits(&bit_ctx,(sps->vui).bitstream_restriction,1);
    if ((sps->vui).bitstream_restriction != 0) {
      mpp_writer_put_bits(&bit_ctx,(sps->vui).motion_vectors_over_pic_boundaries,1);
      mpp_writer_put_ue(&bit_ctx,(sps->vui).max_bytes_per_pic_denom);
      mpp_writer_put_ue(&bit_ctx,(sps->vui).max_bits_per_mb_denom);
      mpp_writer_put_ue(&bit_ctx,(sps->vui).log2_max_mv_length_horizontal);
      mpp_writer_put_ue(&bit_ctx,(sps->vui).log2_max_mv_length_vertical);
      mpp_writer_put_ue(&bit_ctx,(sps->vui).num_reorder_frames);
      mpp_writer_put_ue(&bit_ctx,(sps->vui).max_dec_frame_buffering);
    }
  }
  mpp_writer_trailing(&bit_ctx);
  RVar1 = mpp_writer_bytes(&bit_ctx);
  if (len != (RK_S32 *)0x0) {
    *len = RVar1;
  }
  if (offset != (RK_S32 *)0x0) {
    *offset = (RK_S32)sVar5;
  }
  mpp_packet_set_length(packet,sVar5 + (long)RVar1);
  return MPP_OK;
}

Assistant:

MPP_RET h264e_sps_to_packet(H264eSps *sps, MppPacket packet, RK_S32 *offset,
                            RK_S32 *len, MppEncCfgSet *cfg)
{
    void *pos = mpp_packet_get_pos(packet);
    void *data = mpp_packet_get_data(packet);
    size_t size = mpp_packet_get_size(packet);
    size_t length = mpp_packet_get_length(packet);
    void *p = pos + length;
    RK_S32 buf_size = (data + size) - (pos + length);
    MppWriteCtx bit_ctx;
    MppWriteCtx *bit = &bit_ctx;
    RK_S32 sps_size = 0;
    static const RK_U32 SubWidthC[4]  = { 1, 2, 2, 1};
    static const RK_U32 SubHeightC[4] = { 1, 2, 1, 1};

    mpp_writer_init(bit, p, buf_size);

    /* start_code_prefix 00 00 00 01 */
    mpp_writer_put_raw_bits(bit, 0, 24);
    mpp_writer_put_raw_bits(bit, 1, 8);
    /* forbidden_zero_bit */
    mpp_writer_put_raw_bits(bit, 0, 1);
    /* nal_ref_idc */
    mpp_writer_put_raw_bits(bit, H264_NALU_PRIORITY_HIGHEST, 2);
    /* nal_unit_type */
    mpp_writer_put_raw_bits(bit, H264_NALU_TYPE_SPS, 5);

    /* profile_idc */
    mpp_writer_put_bits(bit, sps->profile_idc, 8);
    /* constraint_set0_flag */
    mpp_writer_put_bits(bit, sps->constraint_set0, 1);
    /* constraint_set1_flag */
    mpp_writer_put_bits(bit, sps->constraint_set1, 1);
    /* constraint_set2_flag */
    mpp_writer_put_bits(bit, sps->constraint_set2, 1);
    /* constraint_set3_flag */
    mpp_writer_put_bits(bit, sps->constraint_set3, 1);
    /* constraint_set4_flag */
    mpp_writer_put_bits(bit, sps->constraint_set4, 1);
    /* constraint_set5_flag */
    mpp_writer_put_bits(bit, sps->constraint_set5, 1);
    /* reserved_zero_2bits */
    mpp_writer_put_bits(bit, 0, 2);

    /* level_idc */
    mpp_writer_put_bits(bit, sps->level_idc, 8);
    /* seq_parameter_set_id */
    mpp_writer_put_ue(bit, sps->sps_id);

    if (sps->profile_idc >= H264_PROFILE_HIGH) {
        /* chroma_format_idc */
        mpp_writer_put_ue(bit, sps->chroma_format_idc);
        /* bit_depth_luma_minus8 */
        mpp_writer_put_ue(bit, 0);
        /* bit_depth_chroma_minus8 */
        mpp_writer_put_ue(bit, 0);
        /* qpprime_y_zero_transform_bypass_flag */
        mpp_writer_put_bits(bit, 0, 1);
        /* seq_scaling_matrix_present_flag */
        mpp_writer_put_bits(bit, 0, 1);
    }

    /* log2_max_frame_num_minus4 */
    mpp_writer_put_ue(bit, sps->log2_max_frame_num_minus4);
    /* pic_order_cnt_type */
    /* accodring usr cfg cfg->codec.h264.poc_type, hw may no support
       will convert after get stream
    */
    mpp_writer_put_ue(bit, cfg->codec.h264.poc_type);
    if (cfg->codec.h264.poc_type == 0) {
        /* log2_max_pic_order_cnt_lsb_minus4 */
        mpp_writer_put_ue(bit, sps->log2_max_poc_lsb_minus4);
    }

    /* max_num_ref_frames */
    mpp_writer_put_ue(bit, sps->num_ref_frames);
    /* gaps_in_frame_num_value_allowed_flag */
    mpp_writer_put_bits(bit, sps->gaps_in_frame_num_value_allowed, 1);

    /* pic_width_in_mbs_minus1 */
    mpp_writer_put_ue(bit, sps->pic_width_in_mbs - 1);
    /* pic_height_in_map_units_minus1 */
    mpp_writer_put_ue(bit, sps->pic_height_in_mbs - 1);

    /* frame_mbs_only_flag */
    mpp_writer_put_bits(bit, sps->frame_mbs_only, 1);
    /* direct_8x8_inference_flag */
    mpp_writer_put_bits(bit, sps->direct8x8_inference, 1);
    /* frame_cropping_flag */
    mpp_writer_put_bits(bit, sps->cropping, 1);
    if (sps->cropping) {
        /* frame_crop_left_offset */
        mpp_writer_put_ue(bit, sps->crop.left / SubWidthC[sps->chroma_format_idc]);
        /* frame_crop_right_offset */
        mpp_writer_put_ue(bit, sps->crop.right / SubWidthC[sps->chroma_format_idc]);
        /* frame_crop_top_offset */
        mpp_writer_put_ue(bit, sps->crop.top / SubHeightC[sps->chroma_format_idc]);
        /* frame_crop_bottom_offset */
        mpp_writer_put_ue(bit, sps->crop.bottom / SubHeightC[sps->chroma_format_idc]);
    }

    /* vui_parameters_present_flag */
    mpp_writer_put_bits(bit, sps->vui.vui_present, 1);
    if (sps->vui.vui_present) {
        H264eVui *vui = &sps->vui;

        /* aspect_ratio_info_present_flag */
        mpp_writer_put_bits(bit, vui->aspect_ratio_info_present, 1);
        if (vui->aspect_ratio_info_present) {
            /* aspect_ratio_idc */
            mpp_writer_put_bits(bit, vui->aspect_ratio_idc, 8);
            if (H264_EXTENDED_SAR == vui->aspect_ratio_idc) {
                /* sar_width */
                mpp_writer_put_bits(bit, vui->sar_width, 16);
                /* sar_height */
                mpp_writer_put_bits(bit, vui->sar_height, 16);
            }
        }

        /* overscan_info_present */
        mpp_writer_put_bits(bit, vui->overscan_info_present, 1);
        if (vui->overscan_info_present) {
            /* overscan_appropriate_flag */
            mpp_writer_put_bits(bit, vui->overscan_appropriate_flag, 1);
        }

        /* video_signal_type_present_flag */
        mpp_writer_put_bits(bit, vui->signal_type_present, 1);
        if (vui->signal_type_present) {
            /* video_format */
            mpp_writer_put_bits(bit, vui->vidformat, 3);
            /* video_full_range_flag */
            mpp_writer_put_bits(bit, vui->fullrange, 1);
            /* colour_description_present_flag */
            mpp_writer_put_bits(bit, vui->color_description_present, 1);
            if (vui->color_description_present) {
                /* colour_primaries */
                mpp_writer_put_bits(bit, vui->colorprim, 8);
                /* transfer_characteristics */
                mpp_writer_put_bits(bit, vui->colortrc, 8);
                /* matrix_coefficients */
                mpp_writer_put_bits(bit, vui->colmatrix, 8);
            }
        }

        /* chroma_loc_info_present_flag */
        mpp_writer_put_bits(bit, vui->chroma_loc_info_present, 1);
        if (vui->chroma_loc_info_present) {
            /* chroma_sample_loc_type_top_field */
            mpp_writer_put_ue(bit, vui->chroma_loc_top);
            /* chroma_sample_loc_type_bottom_field */
            mpp_writer_put_ue(bit, vui->chroma_loc_bottom);
        }

        /* timing_info_present_flag */
        mpp_writer_put_bits(bit, vui->timing_info_present, 1);
        if (vui->timing_info_present) {
            /* num_units_in_tick msb */
            mpp_writer_put_bits(bit, vui->num_units_in_tick >> 16, 16);
            /* num_units_in_tick lsb */
            mpp_writer_put_bits(bit, vui->num_units_in_tick & 0xffff, 16);
            /* time_scale msb */
            mpp_writer_put_bits(bit, vui->time_scale >> 16, 16);
            /* time_scale lsb */
            mpp_writer_put_bits(bit, vui->time_scale & 0xffff, 16);
            /* fixed_frame_rate_flag */
            mpp_writer_put_bits(bit, vui->fixed_frame_rate, 1);
        }

        /* nal_hrd_parameters_present_flag */
        mpp_writer_put_bits(bit, vui->nal_hrd_parameters_present, 1);
        /* vcl_hrd_parameters_present_flag */
        mpp_writer_put_bits(bit, vui->vcl_hrd_parameters_present, 1);
        /* pic_struct_present_flag */
        mpp_writer_put_bits(bit, vui->pic_struct_present, 1);

        /* bit_stream_restriction_flag */
        mpp_writer_put_bits(bit, vui->bitstream_restriction, 1);
        if (vui->bitstream_restriction) {
            /* motion_vectors_over_pic_boundaries */
            mpp_writer_put_bits(bit, vui->motion_vectors_over_pic_boundaries, 1);
            /* max_bytes_per_pic_denom */
            mpp_writer_put_ue(bit, vui->max_bytes_per_pic_denom);
            /* max_bits_per_mb_denom */
            mpp_writer_put_ue(bit, vui->max_bits_per_mb_denom);
            /* log2_mv_length_horizontal */
            mpp_writer_put_ue(bit, vui->log2_max_mv_length_horizontal);
            /* log2_mv_length_vertical */
            mpp_writer_put_ue(bit, vui->log2_max_mv_length_vertical);
            /* num_reorder_frames */
            mpp_writer_put_ue(bit, vui->num_reorder_frames);
            /* max_dec_frame_buffering */
            mpp_writer_put_ue(bit, vui->max_dec_frame_buffering);
        }
    }

    mpp_writer_trailing(bit);

    sps_size = mpp_writer_bytes(bit);
    if (len)
        *len = sps_size;
    if (offset)
        *offset = length;

    mpp_packet_set_length(packet, length + sps_size);

    return MPP_OK;
}